

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = J->chain[op];
  if (uVar2 != 0) {
    pIVar1 = (J->cur).ir;
    do {
      uVar3 = (uint)uVar2;
      if (pIVar1[(ulong)uVar2 + 1] == (IRIns)ptr) goto LAB_001252f2;
      uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6);
    } while (uVar2 != 0);
  }
  uVar3 = (J->cur).nk - 2;
  uVar4 = (ulong)uVar3;
  if (uVar3 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = uVar3;
  pIVar1 = (J->cur).ir;
  pIVar1[uVar4].field_1.op12 = 0;
  pIVar1[uVar4 + 1] = (IRIns)ptr;
  *(undefined1 *)((long)pIVar1 + uVar4 * 8 + 4) = 9;
  *(char *)((long)pIVar1 + uVar4 * 8 + 5) = (char)op;
  *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = J->chain[op];
  J->chain[op] = (IRRef1)uVar3;
LAB_001252f2:
  return uVar3 + 0x9000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
#if LJ_64 && !LJ_GC64
  lj_assertJ((void *)(uintptr_t)u32ptr(ptr) == ptr, "out-of-range GC pointer");
#endif
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_kptr(&cir[ref]) == ptr)
      goto found;
#if LJ_GC64
  ref = ir_nextk64(J);
#else
  ref = ir_nextk(J);
#endif
  ir = IR(ref);
  ir->op12 = 0;
  setmref(ir[LJ_GC64].ptr, ptr);
  ir->t.irt = IRT_PGC;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_PGC);
}